

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::setPlaceholderText(QComboBox *this,QString *placeholderText)

{
  bool bVar1;
  int iVar2;
  QComboBoxPrivate *pQVar3;
  QString *in_RSI;
  QWidget *in_RDI;
  QComboBoxPrivate *d;
  QWidget *in_stack_ffffffffffffffd8;
  int index;
  QWidget *this_00;
  
  this_00 = in_RDI;
  pQVar3 = d_func((QComboBox *)0x538001);
  bVar1 = ::operator==((QString *)in_RDI,(QString *)in_stack_ffffffffffffffd8);
  if (!bVar1) {
    QString::operator=(&pQVar3->placeholderText,in_RSI);
    index = (int)((ulong)in_RSI >> 0x20);
    iVar2 = currentIndex((QComboBox *)in_RDI);
    if (iVar2 == -1) {
      bVar1 = QString::isEmpty((QString *)0x53805a);
      if (bVar1) {
        setCurrentIndex((QComboBox *)this_00,index);
      }
      else {
        QWidget::update(in_stack_ffffffffffffffd8);
      }
    }
    else {
      QWidget::updateGeometry(in_RDI);
    }
  }
  return;
}

Assistant:

void QComboBox::setPlaceholderText(const QString &placeholderText)
{
    Q_D(QComboBox);
    if (placeholderText == d->placeholderText)
        return;

    d->placeholderText = placeholderText;
    if (currentIndex() == -1) {
      if (d->placeholderText.isEmpty())
        setCurrentIndex(0);
      else
        update();
    } else {
      updateGeometry();
    }
}